

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall
cmFindBaseDebugState::cmFindBaseDebugState
          (cmFindBaseDebugState *this,string *commandName,cmFindBase *findBase)

{
  this->FindCommand = findBase;
  std::__cxx11::string::string((string *)&this->CommandName,(string *)commandName);
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FailedSearchLocations).
  super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FoundSearchLocation).regexName._M_dataplus._M_p =
       (pointer)&(this->FoundSearchLocation).regexName.field_2;
  (this->FoundSearchLocation).regexName._M_string_length = 0;
  (this->FoundSearchLocation).regexName.field_2._M_local_buf[0] = '\0';
  (this->FoundSearchLocation).path._M_dataplus._M_p =
       (pointer)&(this->FoundSearchLocation).path.field_2;
  (this->FoundSearchLocation).path._M_string_length = 0;
  (this->FoundSearchLocation).path.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmFindBaseDebugState::cmFindBaseDebugState(std::string commandName,
                                           cmFindBase const* findBase)
  : FindCommand(findBase)
  , CommandName(std::move(commandName))
{
}